

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O3

void u_to_u8_test(int line,UTF_US16 *str1,UTF_S8 *str2,bool ok)

{
  pointer pcVar1;
  char16_t cVar2;
  char16_t cVar3;
  ulong uVar4;
  bool bVar5;
  byte *pbVar6;
  size_type sVar7;
  pointer pcVar8;
  UTF_US8 *pUVar9;
  long lVar10;
  long lVar11;
  ulong in_R8;
  uint uVar12;
  ulong in_R9;
  ulong in_R10;
  ulong in_R11;
  byte bVar13;
  UTF_US8 tmp;
  UTF_UC8 buf [256];
  UTF_US8 local_148;
  byte local_128 [255];
  byte local_29;
  
  pUVar9 = &local_148;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  bVar5 = UTF_u_to_u8<(char)63>(str1,&local_148);
  UTF_test(line,bVar5 == ok);
  uVar4 = str2->_M_string_length;
  sVar7 = local_148._M_string_length;
  if (uVar4 < local_148._M_string_length) {
    sVar7 = uVar4;
  }
  if (sVar7 != 0) {
    in_R8 = 0;
    do {
      bVar13 = (str2->_M_dataplus)._M_p[in_R8];
      in_R9 = (ulong)bVar13;
      if (bVar13 != local_148._M_dataplus._M_p[in_R8]) {
        bVar5 = false;
        goto LAB_00101ad3;
      }
      in_R8 = in_R8 + 1;
    } while (sVar7 != in_R8);
  }
  bVar5 = local_148._M_string_length == uVar4;
LAB_00101ad3:
  UTF_test(line,bVar5);
  bVar5 = true;
  if (str1->_M_string_length == 0) {
    pbVar6 = local_128;
  }
  else {
    pcVar8 = (str1->_M_dataplus)._M_p;
    pcVar1 = pcVar8 + str1->_M_string_length;
    pbVar6 = &local_29;
    lVar10 = 0;
    do {
      cVar2 = *pcVar8;
      uVar12 = (uint)(ushort)cVar2;
      bVar13 = (byte)cVar2;
      if ((uVar12 & 0xfc00) == 0xd800) {
        pcVar8 = pcVar8 + 1;
        if (pcVar8 != pcVar1) {
          cVar3 = *pcVar8;
          if (((ushort)cVar3 & 0xfc00) == 0xdc00) {
            uVar12 = uVar12 * 0x400 + (uint)(ushort)cVar3 + 0xfca02400;
            in_R8 = (ulong)(byte)((byte)(uVar12 >> 0x12) | 0xf0);
            in_R10 = (ulong)((byte)(uVar12 >> 0xc) & 0x3f | 0x80);
            in_R9 = (ulong)((byte)(uVar12 >> 6) & 0x3f | 0x80);
            in_R11 = (ulong)((byte)cVar3 & 0x3f | 0x80);
          }
          else if (cVar3 == L'\0') goto LAB_00101bcc;
          goto LAB_00101bf4;
        }
        if (lVar10 == 0xff) {
LAB_00101c8c:
          bVar5 = false;
        }
        else {
          local_128[lVar10] = 0x3f;
          pbVar6 = local_128 + lVar10 + 1;
        }
        goto LAB_00101c8e;
      }
      if ((ushort)cVar2 < 0x80) {
        if (lVar10 == 0xff) goto LAB_00101c8c;
        local_128[lVar10] = bVar13;
        lVar11 = lVar10 + 1;
        in_R10 = 0;
        in_R8 = (ulong)uVar12;
      }
      else {
        if (uVar12 < 0x800) {
          in_R8 = (ulong)(byte)((byte)((ushort)cVar2 >> 6) | 0xc0);
          in_R10 = (ulong)(bVar13 & 0x3f | 0x80);
          in_R9 = 0;
        }
        else {
LAB_00101bcc:
          in_R8 = (ulong)(byte)((byte)((ushort)cVar2 >> 0xc) | 0xe0);
          in_R10 = (ulong)((byte)((ushort)cVar2 >> 6) & 0x3f | 0x80);
          in_R9 = (ulong)(bVar13 & 0x3f | 0x80);
          in_R11 = 0;
        }
LAB_00101bf4:
        if (lVar10 == 0xff) goto LAB_00101c8c;
        lVar11 = lVar10 + 1;
        local_128[lVar10] = (byte)in_R8;
        if ((byte)in_R10 == 0) {
          in_R10 = 0;
        }
        else {
          if (lVar11 == 0xff) goto LAB_00101c8c;
          lVar11 = lVar10 + 2;
          local_128[lVar10 + 1] = (byte)in_R10;
          if ((byte)in_R9 == 0) {
            in_R9 = 0;
          }
          else {
            if (lVar11 == 0xff) goto LAB_00101c8c;
            lVar11 = lVar10 + 3;
            local_128[lVar10 + 2] = (byte)in_R9;
            if ((byte)in_R11 == 0) {
              in_R11 = 0;
            }
            else {
              if (lVar11 == 0xff) goto LAB_00101c8c;
              local_128[lVar10 + 3] = (byte)in_R11;
              lVar11 = lVar10 + 4;
            }
          }
        }
      }
      pcVar8 = pcVar8 + 1;
      lVar10 = lVar11;
    } while (pcVar8 != pcVar1);
    pbVar6 = local_128 + lVar11;
  }
LAB_00101c8e:
  *pbVar6 = 0;
  UTF_test(line,bVar5);
  bVar13 = *local_148._M_dataplus._M_p;
  if (bVar13 != 0) {
    lVar10 = 0;
    do {
      lVar11 = lVar10;
      if (local_128[lVar11] == 0) {
        pUVar9 = (UTF_US8 *)((long)&local_148._M_dataplus._M_p + lVar11);
        goto LAB_00101cf0;
      }
      bVar5 = local_148._M_string_length + 1 == lVar11;
      if ((bVar13 != local_128[lVar11]) || (local_148._M_string_length + 1 == lVar11))
      goto LAB_00101cf6;
      bVar13 = local_148._M_dataplus._M_p[lVar11 + 1];
      lVar10 = lVar11 + 1;
    } while (bVar13 != 0);
    pUVar9 = (UTF_US8 *)((long)&local_148._M_dataplus._M_p + lVar11 + 1);
  }
  bVar13 = 0;
LAB_00101cf0:
  bVar5 = bVar13 == *(byte *)((long)pUVar9 + 0x20);
LAB_00101cf6:
  UTF_test(line,bVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  return;
}

Assistant:

void u_to_u8_test(int line, const UTF_US16& str1, const UTF_S8& str2, bool ok)
{
    UTF_US8 tmp;
    UTF_UC8 buf[256];
    UTF_test(line, UTF_u_to_u8<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == reinterpret_cast<const UTF_US8&>(str2));
    UTF_test(line, UTF_uj16_to_uj8(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj8_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}